

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  Options *pOVar4;
  EnumOptions *this_00;
  EnumValueDescriptor *pEVar5;
  EnumValueOptions *this_01;
  LogMessage *pLVar6;
  AlphaNum *a;
  AlphaNum *a_00;
  char *pcVar7;
  string_view sVar8;
  string_view enum_name;
  string_view enum_value_name;
  string_view local_2a8;
  string_view local_298;
  AlphaNum local_288;
  string local_258;
  string_view local_238;
  AlphaNum local_228;
  string local_1f8;
  string_view local_1d8;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
  local_1c8;
  int local_1ac;
  undefined1 local_1a8 [4];
  int number;
  string_view local_178;
  undefined8 local_168;
  size_t sStack_160;
  LogMessage local_150;
  Voidify local_139;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_138;
  string_view local_120;
  string_view local_110;
  undefined1 local_100 [8];
  string name;
  string_view original_name;
  int local_bc;
  undefined1 local_b8 [4];
  int i;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  used_number;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_names;
  string_view local_68;
  string local_58;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  pOVar4 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  WriteEnumDocComment(printer,pOVar4,this->descriptor_);
  this_00 = EnumDescriptor::options(this->descriptor_);
  bVar2 = EnumOptions::deprecated(this_00);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"[global::System.ObsoleteAttribute]\n");
    io::Printer::Print<>(pPVar1,local_28);
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"$access_level$ enum $name$ {\n");
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_58,&this->super_SourceGeneratorBase);
  local_68 = EnumDescriptor::name(this->descriptor_);
  pcVar7 = "name";
  io::Printer::
  Print<char[13],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar1,local_38,(char (*) [13])"access_level",&local_58,(char (*) [5])0xc259cc,
             &local_68);
  std::__cxx11::string::~string((string *)&local_58);
  io::Printer::Indent(local_18);
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&used_number.
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8));
  absl::lts_20250127::
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   *)local_b8);
  local_bc = 0;
  while( true ) {
    iVar3 = EnumDescriptor::value_count(this->descriptor_);
    pPVar1 = local_18;
    if (iVar3 <= local_bc) break;
    pOVar4 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
    pEVar5 = EnumDescriptor::value(this->descriptor_,local_bc);
    WriteEnumValueDocComment(pPVar1,pOVar4,pEVar5);
    pEVar5 = EnumDescriptor::value(this->descriptor_,local_bc);
    this_01 = EnumValueDescriptor::options(pEVar5);
    bVar2 = EnumValueOptions::deprecated(this_01);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&original_name._M_str,
                 "[global::System.ObsoleteAttribute]\n");
      io::Printer::Print<>(pPVar1,stack0xffffffffffffff30);
    }
    pEVar5 = EnumDescriptor::value(this->descriptor_,local_bc);
    sVar8 = EnumValueDescriptor::name(pEVar5);
    original_name._M_len = (size_t)sVar8._M_str;
    name.field_2._8_8_ = sVar8._M_len;
    sVar8 = EnumDescriptor::name(this->descriptor_);
    local_110 = sVar8;
    pEVar5 = EnumDescriptor::value(this->descriptor_,local_bc);
    sVar8 = EnumValueDescriptor::name(pEVar5);
    enum_name._M_str = (char *)sVar8._M_len;
    enum_name._M_len = (size_t)local_110._M_str;
    enum_value_name._M_str = pcVar7;
    enum_value_name._M_len = (size_t)sVar8._M_str;
    local_120 = sVar8;
    GetEnumValueName_abi_cxx11_
              ((string *)local_100,(csharp *)local_110._M_len,enum_name,enum_value_name);
    while( true ) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_138,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&used_number.
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                            .settings_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.heap_or_soo_ + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
      if (((local_138.second ^ 0xffU) & 1) == 0) break;
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_enum.cc"
                 ,0x3c);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_150);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar6,(char (*) [22])"Duplicate enum value ");
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,(string *)local_100);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar6,(char (*) [14])" (originally ");
      local_168 = name.field_2._8_8_;
      sStack_160 = original_name._M_len;
      sVar8._M_str = (char *)original_name._M_len;
      sVar8._M_len = name.field_2._8_8_;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,sVar8);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar6,(char (*) [6])") in ");
      sVar8 = EnumDescriptor::name(this->descriptor_);
      local_178 = sVar8;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,sVar8);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar6,(char (*) [35])"; adding underscore to distinguish");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_139,pLVar6);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_150);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_1a8,"_");
      absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_100,(AlphaNum *)local_1a8);
    }
    pEVar5 = EnumDescriptor::value(this->descriptor_,local_bc);
    local_1ac = EnumValueDescriptor::number(pEVar5);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::insert<int,_0>(&local_1c8,
                     (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)local_b8,&local_1ac);
    pPVar1 = local_18;
    if (((local_1c8.second ^ 0xffU) & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_238,"[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n");
      absl::lts_20250127::AlphaNum::AlphaNum(&local_288,local_1ac);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_258,(lts_20250127 *)&local_288,a_00);
      pcVar7 = "name";
      io::Printer::
      Print<char[14],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (pPVar1,local_238,(char (*) [14])"original_name",
                 (basic_string_view<char,_std::char_traits<char>_> *)((long)&name.field_2 + 8),
                 (char (*) [5])0xc259cc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 (char (*) [7])0xbe447d,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1d8,
                 "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n"
                );
      absl::lts_20250127::AlphaNum::AlphaNum(&local_228,local_1ac);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_1f8,(lts_20250127 *)&local_228,a);
      pcVar7 = "name";
      io::Printer::
      Print<char[14],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (pPVar1,local_1d8,(char (*) [14])"original_name",
                 (basic_string_view<char,_std::char_traits<char>_> *)((long)&name.field_2 + 8),
                 (char (*) [5])0xc259cc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 (char (*) [7])0xbe447d,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::__cxx11::string::~string((string *)local_100);
    local_bc = local_bc + 1;
  }
  io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_298,"}\n");
  io::Printer::Print<>(pPVar1,local_298);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,"\n");
  io::Printer::Print<>(pPVar1,local_2a8);
  absl::lts_20250127::
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::~flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)local_b8);
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&used_number.
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.heap_or_soo_ + 8));
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, options(), descriptor_);
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
  printer->Print("$access_level$ enum $name$ {\n",
                 "access_level", class_access_level(),
                 "name", descriptor_->name());
  printer->Indent();
  absl::flat_hash_set<std::string> used_names;
  absl::flat_hash_set<int> used_number;
  for (int i = 0; i < descriptor_->value_count(); i++) {
    WriteEnumValueDocComment(printer, options(), descriptor_->value(i));
    if (descriptor_->value(i)->options().deprecated()) {
      printer->Print("[global::System.ObsoleteAttribute]\n");
    }
    const absl::string_view original_name = descriptor_->value(i)->name();
    std::string name =
        GetEnumValueName(descriptor_->name(), descriptor_->value(i)->name());
    // Make sure we don't get any duplicate names due to prefix removal.
    while (!used_names.insert(name).second) {
      // It's possible we'll end up giving this warning multiple times, but
      // that's better than not at all.
      ABSL_LOG(WARNING) << "Duplicate enum value " << name << " (originally "
                        << original_name << ") in " << descriptor_->name()
                        << "; adding underscore to distinguish";
      absl::StrAppend(&name, "_");
    }
    int number = descriptor_->value(i)->number();
    if (!used_number.insert(number).second) {
      printer->Print(
          "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] "
          "$name$ = $number$,\n",
          "original_name", original_name, "name", name, "number",
          absl::StrCat(number));
    } else {
      printer->Print(
          "[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
          "original_name", original_name, "name", name, "number",
          absl::StrCat(number));
    }
  }
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}